

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_hmac_setup_internal
          (psa_hmac_internal_data *hmac,uint8_t *key,size_t key_length,psa_algorithm_t hash_alg)

{
  size_t input_length;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  psa_status_t local_d4;
  psa_status_t status;
  size_t block_size;
  size_t hash_size;
  size_t i;
  uint8_t ipad [128];
  size_t sStack_28;
  psa_algorithm_t hash_alg_local;
  size_t key_length_local;
  uint8_t *key_local;
  psa_hmac_internal_data *hmac_local;
  
  if ((hash_alg & 0xff | 0x1000000) == 0x1000001) {
    local_d8 = 0x10;
  }
  else {
    if ((hash_alg & 0xff | 0x1000000) == 0x1000002) {
      local_dc = 0x10;
    }
    else {
      if ((hash_alg & 0xff | 0x1000000) == 0x1000003) {
        local_e0 = 0x10;
      }
      else {
        if ((hash_alg & 0xff | 0x1000000) == 0x1000004) {
          local_e4 = 0x14;
        }
        else {
          if ((hash_alg & 0xff | 0x1000000) == 0x1000005) {
            local_e8 = 0x14;
          }
          else {
            if ((hash_alg & 0xff | 0x1000000) == 0x1000008) {
              local_ec = 0x1c;
            }
            else {
              if ((hash_alg & 0xff | 0x1000000) == 0x1000009) {
                local_f0 = 0x20;
              }
              else {
                if ((hash_alg & 0xff | 0x1000000) == 0x100000a) {
                  local_f4 = 0x30;
                }
                else {
                  if ((hash_alg & 0xff | 0x1000000) == 0x100000b) {
                    local_f8 = 0x40;
                  }
                  else {
                    if ((hash_alg & 0xff | 0x1000000) == 0x100000c) {
                      local_fc = 0x1c;
                    }
                    else {
                      if ((hash_alg & 0xff | 0x1000000) == 0x100000d) {
                        local_100 = 0x20;
                      }
                      else {
                        if ((hash_alg & 0xff | 0x1000000) == 0x1000010) {
                          local_104 = 0x1c;
                        }
                        else {
                          if ((hash_alg & 0xff | 0x1000000) == 0x1000011) {
                            local_108 = 0x20;
                          }
                          else {
                            if ((hash_alg & 0xff | 0x1000000) == 0x1000012) {
                              local_10c = 0x30;
                            }
                            else {
                              local_10c = 0;
                              if ((hash_alg & 0xff | 0x1000000) == 0x1000013) {
                                local_10c = 0x40;
                              }
                            }
                            local_108 = local_10c;
                          }
                          local_104 = local_108;
                        }
                        local_100 = local_104;
                      }
                      local_fc = local_100;
                    }
                    local_f8 = local_fc;
                  }
                  local_f4 = local_f8;
                }
                local_f0 = local_f4;
              }
              local_ec = local_f0;
            }
            local_e8 = local_ec;
          }
          local_e4 = local_e8;
        }
        local_e0 = local_e4;
      }
      local_dc = local_e0;
    }
    local_d8 = local_dc;
  }
  sStack_28 = key_length;
  key_length_local = (size_t)key;
  key_local = (uint8_t *)hmac;
  input_length = psa_get_hash_block_size(hash_alg);
  if (0x80 < input_length) {
    return -0x86;
  }
  if (0x80 < input_length) {
    return -0x86;
  }
  if (input_length < (ulong)(long)local_d8) {
    return -0x86;
  }
  if (input_length < sStack_28) {
    local_d4 = psa_hash_compute(hash_alg,(uint8_t *)key_length_local,sStack_28,(uint8_t *)&i,0x80,
                                &stack0xffffffffffffffd8);
    if (local_d4 != 0) goto LAB_0011651f;
  }
  else if (sStack_28 != 0) {
    memcpy(&i,(void *)key_length_local,sStack_28);
  }
  for (hash_size = 0; hash_size < sStack_28; hash_size = hash_size + 1) {
    ipad[hash_size - 8] = ipad[hash_size - 8] ^ 0x36;
  }
  memset(ipad + (sStack_28 - 8),0x36,input_length - sStack_28);
  for (hash_size = 0; hash_size < sStack_28; hash_size = hash_size + 1) {
    key_local[hash_size + 0xe0] = ipad[hash_size - 8] ^ 0x6a;
  }
  memset(key_local + sStack_28 + 0xe0,0x5c,input_length - sStack_28);
  local_d4 = psa_hash_setup((psa_hash_operation_t *)key_local,hash_alg);
  if (local_d4 == 0) {
    local_d4 = psa_hash_update((psa_hash_operation_t *)key_local,(uint8_t *)&i,input_length);
  }
LAB_0011651f:
  mbedtls_platform_zeroize(&i,0x80);
  return local_d4;
}

Assistant:

static psa_status_t psa_hmac_setup_internal( psa_hmac_internal_data *hmac,
                                             const uint8_t *key,
                                             size_t key_length,
                                             psa_algorithm_t hash_alg )
{
    uint8_t ipad[PSA_HMAC_MAX_HASH_BLOCK_SIZE];
    size_t i;
    size_t hash_size = PSA_HASH_SIZE( hash_alg );
    size_t block_size = psa_get_hash_block_size( hash_alg );
    psa_status_t status;

    /* Sanity checks on block_size, to guarantee that there won't be a buffer
     * overflow below. This should never trigger if the hash algorithm
     * is implemented correctly. */
    /* The size checks against the ipad and opad buffers cannot be written
     * `block_size > sizeof( ipad ) || block_size > sizeof( hmac->opad )`
     * because that triggers -Wlogical-op on GCC 7.3. */
    if( block_size > sizeof( ipad ) )
        return( PSA_ERROR_NOT_SUPPORTED );
    if( block_size > sizeof( hmac->opad ) )
        return( PSA_ERROR_NOT_SUPPORTED );
    if( block_size < hash_size )
        return( PSA_ERROR_NOT_SUPPORTED );

    if( key_length > block_size )
    {
        status = psa_hash_compute( hash_alg, key, key_length,
                                   ipad, sizeof( ipad ), &key_length );
        if( status != PSA_SUCCESS )
            goto cleanup;
    }
    /* A 0-length key is not commonly used in HMAC when used as a MAC,
     * but it is permitted. It is common when HMAC is used in HKDF, for
     * example. Don't call `memcpy` in the 0-length because `key` could be
     * an invalid pointer which would make the behavior undefined. */
    else if( key_length != 0 )
        memcpy( ipad, key, key_length );

    /* ipad contains the key followed by garbage. Xor and fill with 0x36
     * to create the ipad value. */
    for( i = 0; i < key_length; i++ )
        ipad[i] ^= 0x36;
    memset( ipad + key_length, 0x36, block_size - key_length );

    /* Copy the key material from ipad to opad, flipping the requisite bits,
     * and filling the rest of opad with the requisite constant. */
    for( i = 0; i < key_length; i++ )
        hmac->opad[i] = ipad[i] ^ 0x36 ^ 0x5C;
    memset( hmac->opad + key_length, 0x5C, block_size - key_length );

    status = psa_hash_setup( &hmac->hash_ctx, hash_alg );
    if( status != PSA_SUCCESS )
        goto cleanup;

    status = psa_hash_update( &hmac->hash_ctx, ipad, block_size );

cleanup:
    mbedtls_platform_zeroize( ipad, sizeof(ipad) );

    return( status );
}